

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  int in_ECX;
  float *pfVar2;
  undefined4 in_register_00000014;
  ShaderEvalContext *extraout_RDX;
  ShaderEvalContext *extraout_RDX_00;
  ShaderEvalContext *evalCtx_00;
  long lVar3;
  long lVar4;
  float *this;
  Type in1;
  Type in0;
  Matrix<float,_3,_3> retVal;
  Vector<float,_3> VStack_a8;
  Mat3 local_9c;
  Mat3 local_78;
  Mat3 local_54;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              (&local_78,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    evalCtx_00 = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix(&local_78,(float *)sr::(anonymous_namespace)::s_constInMat3x3);
    evalCtx_00 = extraout_RDX_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              (&local_9c,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix
              (&local_9c,(float *)(sr::(anonymous_namespace)::s_constInMat3x3 + 0x24));
  }
  this = (float *)&local_54;
  tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)this);
  pfVar1 = (float *)&local_9c;
  pfVar2 = (float *)&local_78;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 0x24; lVar4 = lVar4 + 0xc) {
      *(float *)((long)this + lVar4) =
           *(float *)((long)pfVar2 + lVar4) * *(float *)((long)pfVar1 + lVar4);
    }
    this = this + 1;
    pfVar1 = pfVar1 + 1;
    pfVar2 = pfVar2 + 1;
  }
  reduceToVec3((MatrixCaseUtils *)&VStack_a8,&local_54);
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&VStack_a8);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}